

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O2

void __thiscall pbrt::CameraBase::FindMinimumDifferentials(CameraBase *this,CameraHandle *camera)

{
  undefined4 uVar1;
  undefined4 uVar2;
  CameraSample sample;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  CameraRayDifferential *p;
  int iVar5;
  type tVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 extraout_var [56];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined8 uVar19;
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  Vector3<float> VVar21;
  Vector3f VVar22;
  Frame f;
  SampledWavelengths lambda;
  optional<pbrt::CameraRayDifferential> crd;
  Tuple3<pbrt::Vector3,_float> local_1c8;
  float local_1b8;
  float fStack_1b4;
  undefined8 uStack_1b0;
  Vector3f *local_1a0;
  Vector3f *local_198;
  float local_190;
  float local_18c;
  Tuple3<pbrt::Vector3,_float> local_188;
  Tuple3<pbrt::Vector3,_float> local_178;
  undefined1 local_168 [16];
  Vector3f *local_158;
  Vector3f *local_150;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  CameraHandle *local_120;
  float local_118;
  float fStack_114;
  undefined8 uStack_110;
  undefined8 local_108;
  Frame local_100;
  undefined1 local_d8 [16];
  SampledWavelengths local_c8;
  optional<pbrt::CameraRayDifferential> local_a8;
  undefined1 auVar20 [56];
  
  auVar7._8_4_ = 0x7f800000;
  auVar7._0_8_ = 0x7f8000007f800000;
  auVar7._12_4_ = 0x7f800000;
  local_158 = &this->minDirDifferentialY;
  local_150 = &this->minDirDifferentialX;
  local_1a0 = &this->minPosDifferentialY;
  local_198 = &this->minPosDifferentialX;
  uVar19 = vmovlps_avx(auVar7);
  (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar19;
  (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar19 >> 0x20);
  (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.z = INFINITY;
  (this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.z = INFINITY;
  uVar1 = (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.x;
  uVar2 = (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.y;
  (this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar1;
  (this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar2;
  (this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.z = INFINITY;
  (this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar1;
  (this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar2;
  (this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.z = INFINITY;
  (this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar1;
  (this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar2;
  local_120 = camera;
  SampledWavelengths::SampleXYZ(&local_c8,0.5);
  for (iVar5 = 0; iVar5 != 0x200; iVar5 = iVar5 + 1) {
    uVar19 = *(undefined8 *)
              ((this->film).super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits &
              0xffffffffffff);
    local_118 = ((float)iVar5 / 511.0) * (float)(int)uVar19;
    fStack_114 = ((float)iVar5 / 511.0) * (float)(int)((ulong)uVar19 >> 0x20);
    uStack_110 = 0x3f0000003f000000;
    local_108 = 0x3f8000003f000000;
    sample.pFilm.super_Tuple2<pbrt::Point2,_float>.y = fStack_114;
    sample.pFilm.super_Tuple2<pbrt::Point2,_float>.x = local_118;
    auVar20 = ZEXT856(0x3f0000003f000000);
    sample.pLens.super_Tuple2<pbrt::Point2,_float>.x = 0.5;
    sample.pLens.super_Tuple2<pbrt::Point2,_float>.y = 0.5;
    sample.time = 0.5;
    sample.weight = 1.0;
    CameraHandle::GenerateRayDifferential(&local_a8,local_120,sample,&local_c8);
    if (local_a8.set == true) {
      p = pstd::optional<pbrt::CameraRayDifferential>::value(&local_a8);
      VVar21 = Point3<float>::operator-(&(p->ray).rxOrigin,(Point3<float> *)p);
      local_100.x.super_Tuple3<pbrt::Vector3,_float>.z = VVar21.super_Tuple3<pbrt::Vector3,_float>.z
      ;
      auVar8._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar8._8_56_ = auVar20;
      local_100.x.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar8._0_16_);
      auVar20 = (undefined1  [56])0x0;
      VVar22 = CameraTransform::CameraFromRender
                         (&this->cameraTransform,&local_100.x,(p->ray).super_Ray.time);
      local_178.z = VVar22.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar9._0_8_ = VVar22.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar9._8_56_ = auVar20;
      local_178._0_8_ = vmovlps_avx(auVar9._0_16_);
      local_1b8 = Length<float>((Vector3<float> *)&local_178);
      tVar6 = Length<float>(local_198);
      if (local_1b8 < tVar6) {
        (local_198->super_Tuple3<pbrt::Vector3,_float>).z = local_178.z;
        (local_198->super_Tuple3<pbrt::Vector3,_float>).x = local_178.x;
        (local_198->super_Tuple3<pbrt::Vector3,_float>).y = local_178.y;
      }
      auVar20 = extraout_var;
      VVar21 = Point3<float>::operator-(&(p->ray).ryOrigin,(Point3<float> *)p);
      local_100.x.super_Tuple3<pbrt::Vector3,_float>.z = VVar21.super_Tuple3<pbrt::Vector3,_float>.z
      ;
      auVar10._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar10._8_56_ = auVar20;
      local_100.x.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar10._0_16_);
      auVar20 = (undefined1  [56])0x0;
      VVar22 = CameraTransform::CameraFromRender
                         (&this->cameraTransform,&local_100.x,(p->ray).super_Ray.time);
      local_188.z = VVar22.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar11._0_8_ = VVar22.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar11._8_56_ = auVar20;
      local_188._0_8_ = vmovlps_avx(auVar11._0_16_);
      local_1b8 = Length<float>((Vector3<float> *)&local_188);
      tVar6 = Length<float>(local_1a0);
      if (local_1b8 < tVar6) {
        (local_1a0->super_Tuple3<pbrt::Vector3,_float>).z = local_188.z;
        (local_1a0->super_Tuple3<pbrt::Vector3,_float>).x = local_188.x;
        (local_1a0->super_Tuple3<pbrt::Vector3,_float>).y = local_188.y;
      }
      auVar20 = extraout_var_00;
      VVar21 = Normalize<float>(&(p->ray).super_Ray.d);
      auVar12._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar12._8_56_ = auVar20;
      uVar19 = vmovlps_avx(auVar12._0_16_);
      (p->ray).super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar19;
      (p->ray).super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)uVar19 >> 0x20);
      (p->ray).super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z =
           VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
      VVar21 = Normalize<float>(&(p->ray).rxDirection);
      auVar13._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar13._8_56_ = auVar20;
      uVar19 = vmovlps_avx(auVar13._0_16_);
      (p->ray).rxDirection.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar19;
      (p->ray).rxDirection.super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)uVar19 >> 0x20);
      (p->ray).rxDirection.super_Tuple3<pbrt::Vector3,_float>.z =
           VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
      VVar21 = Normalize<float>(&(p->ray).ryDirection);
      auVar14._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar14._8_56_ = auVar20;
      uVar19 = vmovlps_avx(auVar14._0_16_);
      (p->ray).ryDirection.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar19;
      (p->ray).ryDirection.super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)uVar19 >> 0x20);
      (p->ray).ryDirection.super_Tuple3<pbrt::Vector3,_float>.z =
           VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
      Frame::FromZ(&local_100,(Vector3f)(p->ray).super_Ray.d.super_Tuple3<pbrt::Vector3,_float>);
      uVar19 = 0;
      VVar22 = Frame::ToLocal(&local_100,(p->ray).super_Ray.d.super_Tuple3<pbrt::Vector3,_float>);
      local_1b8 = VVar22.super_Tuple3<pbrt::Vector3,_float>.x;
      fStack_1b4 = VVar22.super_Tuple3<pbrt::Vector3,_float>.y;
      local_148._0_4_ = VVar22.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar20 = ZEXT856(0);
      uStack_1b0 = uVar19;
      VVar22 = Frame::ToLocal(&local_100,(p->ray).rxDirection.super_Tuple3<pbrt::Vector3,_float>);
      local_1c8.z = VVar22.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar15._0_8_ = VVar22.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar15._8_56_ = auVar20;
      local_1c8._0_8_ = vmovlps_avx(auVar15._0_16_);
      VVar21 = Normalize<float>((Vector3<float> *)&local_1c8);
      auVar16._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar16._8_56_ = auVar20;
      local_168 = auVar16._0_16_;
      local_138._0_4_ = VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar20 = ZEXT856(0);
      VVar22 = Frame::ToLocal(&local_100,(p->ray).ryDirection.super_Tuple3<pbrt::Vector3,_float>);
      local_1c8.z = VVar22.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar17._0_8_ = VVar22.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar17._8_56_ = auVar20;
      local_1c8._0_8_ = vmovlps_avx(auVar17._0_16_);
      VVar21 = Normalize<float>((Vector3<float> *)&local_1c8);
      local_18c = VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar18._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar18._8_56_ = auVar20;
      local_d8 = auVar18._0_16_;
      auVar3._4_4_ = fStack_1b4;
      auVar3._0_4_ = local_1b8;
      auVar3._8_8_ = uStack_1b0;
      auVar7 = vsubps_avx(local_168,auVar3);
      local_1c8.z = (float)local_138._0_4_ - (float)local_148._0_4_;
      local_1c8._0_8_ = vmovlps_avx(auVar7);
      local_190 = local_1c8.z;
      local_138 = auVar7;
      tVar6 = Length<float>((Vector3<float> *)&local_1c8);
      local_168._0_4_ = tVar6;
      tVar6 = Length<float>(local_150);
      if ((float)local_168._0_4_ < tVar6) {
        uVar19 = vmovlps_avx(local_138);
        (this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar19;
        (this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.y =
             (float)(int)((ulong)uVar19 >> 0x20);
        (this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.z = local_190;
      }
      auVar4._4_4_ = fStack_1b4;
      auVar4._0_4_ = local_1b8;
      auVar4._8_8_ = uStack_1b0;
      auVar7 = vsubps_avx(local_d8,auVar4);
      local_1c8.z = local_18c - (float)local_148._0_4_;
      local_1c8._0_8_ = vmovlps_avx(auVar7);
      local_168._0_4_ = local_1c8.z;
      local_148 = auVar7;
      local_1b8 = Length<float>((Vector3<float> *)&local_1c8);
      tVar6 = Length<float>(local_158);
      if (local_1b8 < tVar6) {
        uVar19 = vmovlps_avx(local_148);
        (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar19;
        (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.y =
             (float)(int)((ulong)uVar19 >> 0x20);
        (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.z = (float)local_168._0_4_;
      }
    }
    pstd::optional<pbrt::CameraRayDifferential>::~optional(&local_a8);
  }
  if (LOGGING_LogLevel < 1) {
    Log<pbrt::Vector3<float>&,pbrt::Vector3<float>&>
              (Verbose,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cameras.cpp"
               ,0xe7,"Camera min pos differentials: %s, %s",local_198,local_1a0);
    if (LOGGING_LogLevel < 1) {
      Log<pbrt::Vector3<float>&,pbrt::Vector3<float>&>
                (Verbose,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cameras.cpp"
                 ,0xe9,"Camera min dir differentials: %s, %s",local_150,local_158);
    }
  }
  return;
}

Assistant:

void CameraBase::FindMinimumDifferentials(CameraHandle camera) {
    minPosDifferentialX = minPosDifferentialY = minDirDifferentialX =
        minDirDifferentialY = Vector3f(Infinity, Infinity, Infinity);

    CameraSample sample;
    sample.pLens = Point2f(0.5, 0.5);
    sample.time = 0.5;
    SampledWavelengths lambda = SampledWavelengths::SampleXYZ(0.5);

    int n = 512;
    for (int i = 0; i < n; ++i) {
        sample.pFilm.x = Float(i) / (n - 1) * film.FullResolution().x;
        sample.pFilm.y = Float(i) / (n - 1) * film.FullResolution().y;

        pstd::optional<CameraRayDifferential> crd =
            camera.GenerateRayDifferential(sample, lambda);
        if (!crd)
            continue;

        RayDifferential &ray = crd->ray;
        Vector3f dox = CameraFromRender(ray.rxOrigin - ray.o, ray.time);
        if (Length(dox) < Length(minPosDifferentialX))
            minPosDifferentialX = dox;
        Vector3f doy = CameraFromRender(ray.ryOrigin - ray.o, ray.time);
        if (Length(doy) < Length(minPosDifferentialY))
            minPosDifferentialY = doy;

        ray.d = Normalize(ray.d);
        ray.rxDirection = Normalize(ray.rxDirection);
        ray.ryDirection = Normalize(ray.ryDirection);

        Frame f = Frame::FromZ(ray.d);
        Vector3f df = f.ToLocal(ray.d);  // should be (0, 0, 1);
        Vector3f dxf = Normalize(f.ToLocal(ray.rxDirection));
        Vector3f dyf = Normalize(f.ToLocal(ray.ryDirection));

        if (Length(dxf - df) < Length(minDirDifferentialX))
            minDirDifferentialX = dxf - df;
        if (Length(dyf - df) < Length(minDirDifferentialY))
            minDirDifferentialY = dyf - df;
    }

    LOG_VERBOSE("Camera min pos differentials: %s, %s", minPosDifferentialX,
                minPosDifferentialY);
    LOG_VERBOSE("Camera min dir differentials: %s, %s", minDirDifferentialX,
                minDirDifferentialY);
}